

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O0

SimpleString __thiscall MockNamedValue::toString(MockNamedValue *this)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t extraout_RDX_03;
  size_t extraout_RDX_04;
  size_t extraout_RDX_05;
  size_t extraout_RDX_06;
  long in_RSI;
  SimpleString SVar4;
  SimpleString local_278;
  SimpleString local_268;
  SimpleString local_258;
  SimpleString local_248;
  SimpleString local_238;
  SimpleString local_228;
  SimpleString local_218;
  SimpleString local_208;
  SimpleString local_1f8;
  SimpleString local_1e8;
  SimpleString local_1d8;
  SimpleString local_1c8;
  SimpleString local_1b8;
  SimpleString local_1a8;
  SimpleString local_198;
  SimpleString local_188;
  SimpleString local_178;
  SimpleString local_168;
  SimpleString local_158;
  SimpleString local_148;
  SimpleString local_138;
  SimpleString local_128;
  SimpleString local_118;
  SimpleString local_108;
  SimpleString local_f8;
  SimpleString local_e8;
  SimpleString local_d8;
  SimpleString local_c8;
  SimpleString local_b8;
  SimpleString local_a8;
  SimpleString local_98;
  SimpleString local_88;
  SimpleString local_78;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48 [2];
  SimpleString local_28;
  MockNamedValue *this_local;
  
  this_local = this;
  SimpleString::SimpleString(&local_28,"bool");
  bVar1 = operator==((SimpleString *)(in_RSI + 0x18),&local_28);
  SimpleString::~SimpleString(&local_28);
  if (bVar1) {
    SVar4 = ::StringFrom(SUB81(this,0));
    sVar3 = SVar4.bufferSize_;
  }
  else {
    SimpleString::SimpleString(local_48,"int");
    bVar1 = operator==((SimpleString *)(in_RSI + 0x18),local_48);
    SimpleString::~SimpleString(local_48);
    if (bVar1) {
      ::StringFrom((int)&local_68);
      SimpleString::SimpleString(&local_78," ");
      SimpleString::operator+(&local_58,&local_68);
      BracketsFormattedHexStringFrom((int)&local_88);
      SimpleString::operator+((SimpleString *)this,&local_58);
      SimpleString::~SimpleString(&local_88);
      SimpleString::~SimpleString(&local_58);
      SimpleString::~SimpleString(&local_78);
      SimpleString::~SimpleString(&local_68);
      sVar3 = extraout_RDX;
    }
    else {
      SimpleString::SimpleString(&local_98,"unsigned int");
      bVar1 = operator==((SimpleString *)(in_RSI + 0x18),&local_98);
      SimpleString::~SimpleString(&local_98);
      if (bVar1) {
        ::StringFrom((uint)&local_b8);
        SimpleString::SimpleString(&local_c8," ");
        SimpleString::operator+(&local_a8,&local_b8);
        BracketsFormattedHexStringFrom((uint)&local_d8);
        SimpleString::operator+((SimpleString *)this,&local_a8);
        SimpleString::~SimpleString(&local_d8);
        SimpleString::~SimpleString(&local_a8);
        SimpleString::~SimpleString(&local_c8);
        SimpleString::~SimpleString(&local_b8);
        sVar3 = extraout_RDX_00;
      }
      else {
        SimpleString::SimpleString(&local_e8,"long int");
        bVar1 = operator==((SimpleString *)(in_RSI + 0x18),&local_e8);
        SimpleString::~SimpleString(&local_e8);
        if (bVar1) {
          ::StringFrom((long)&local_108);
          SimpleString::SimpleString(&local_118," ");
          SimpleString::operator+(&local_f8,&local_108);
          BracketsFormattedHexStringFrom((long)&local_128);
          SimpleString::operator+((SimpleString *)this,&local_f8);
          SimpleString::~SimpleString(&local_128);
          SimpleString::~SimpleString(&local_f8);
          SimpleString::~SimpleString(&local_118);
          SimpleString::~SimpleString(&local_108);
          sVar3 = extraout_RDX_01;
        }
        else {
          SimpleString::SimpleString(&local_138,"unsigned long int");
          bVar1 = operator==((SimpleString *)(in_RSI + 0x18),&local_138);
          SimpleString::~SimpleString(&local_138);
          if (bVar1) {
            ::StringFrom((unsigned_long)&local_158);
            SimpleString::SimpleString(&local_168," ");
            SimpleString::operator+(&local_148,&local_158);
            BracketsFormattedHexStringFrom((unsigned_long)&local_178);
            SimpleString::operator+((SimpleString *)this,&local_148);
            SimpleString::~SimpleString(&local_178);
            SimpleString::~SimpleString(&local_148);
            SimpleString::~SimpleString(&local_168);
            SimpleString::~SimpleString(&local_158);
            sVar3 = extraout_RDX_02;
          }
          else {
            SimpleString::SimpleString(&local_188,"long long int");
            bVar1 = operator==((SimpleString *)(in_RSI + 0x18),&local_188);
            SimpleString::~SimpleString(&local_188);
            if (bVar1) {
              ::StringFrom((cpputest_longlong)&local_1a8);
              SimpleString::SimpleString(&local_1b8," ");
              SimpleString::operator+(&local_198,&local_1a8);
              BracketsFormattedHexStringFrom((cpputest_longlong)&local_1c8);
              SimpleString::operator+((SimpleString *)this,&local_198);
              SimpleString::~SimpleString(&local_1c8);
              SimpleString::~SimpleString(&local_198);
              SimpleString::~SimpleString(&local_1b8);
              SimpleString::~SimpleString(&local_1a8);
              sVar3 = extraout_RDX_03;
            }
            else {
              SimpleString::SimpleString(&local_1d8,"unsigned long long int");
              bVar1 = operator==((SimpleString *)(in_RSI + 0x18),&local_1d8);
              SimpleString::~SimpleString(&local_1d8);
              if (bVar1) {
                ::StringFrom((cpputest_ulonglong)&local_1f8);
                SimpleString::SimpleString(&local_208," ");
                SimpleString::operator+(&local_1e8,&local_1f8);
                BracketsFormattedHexStringFrom((cpputest_ulonglong)&local_218);
                SimpleString::operator+((SimpleString *)this,&local_1e8);
                SimpleString::~SimpleString(&local_218);
                SimpleString::~SimpleString(&local_1e8);
                SimpleString::~SimpleString(&local_208);
                SimpleString::~SimpleString(&local_1f8);
                sVar3 = extraout_RDX_04;
              }
              else {
                SimpleString::SimpleString(&local_228,"const char*");
                bVar1 = operator==((SimpleString *)(in_RSI + 0x18),&local_228);
                SimpleString::~SimpleString(&local_228);
                if (bVar1) {
                  SimpleString::SimpleString((SimpleString *)this,*(char **)(in_RSI + 0x28));
                  sVar3 = extraout_RDX_05;
                }
                else {
                  SimpleString::SimpleString(&local_238,"void*");
                  bVar1 = operator==((SimpleString *)(in_RSI + 0x18),&local_238);
                  SimpleString::~SimpleString(&local_238);
                  if (bVar1) {
                    SVar4 = ::StringFrom(this);
                    sVar3 = SVar4.bufferSize_;
                  }
                  else {
                    SimpleString::SimpleString(&local_248,"void (*)()");
                    bVar1 = operator==((SimpleString *)(in_RSI + 0x18),&local_248);
                    SimpleString::~SimpleString(&local_248);
                    if (bVar1) {
                      SVar4 = ::StringFrom((_func_void *)this);
                      sVar3 = SVar4.bufferSize_;
                    }
                    else {
                      SimpleString::SimpleString(&local_258,"const void*");
                      bVar1 = operator==((SimpleString *)(in_RSI + 0x18),&local_258);
                      SimpleString::~SimpleString(&local_258);
                      if (bVar1) {
                        SVar4 = ::StringFrom(this);
                        sVar3 = SVar4.bufferSize_;
                      }
                      else {
                        SimpleString::SimpleString(&local_268,"double");
                        bVar1 = operator==((SimpleString *)(in_RSI + 0x18),&local_268);
                        SimpleString::~SimpleString(&local_268);
                        if (bVar1) {
                          SVar4 = ::StringFrom(*(double *)(in_RSI + 0x28),(int)this);
                          sVar3 = SVar4.bufferSize_;
                        }
                        else {
                          SimpleString::SimpleString(&local_278,"const unsigned char*");
                          bVar1 = operator==((SimpleString *)(in_RSI + 0x18),&local_278);
                          SimpleString::~SimpleString(&local_278);
                          if (bVar1) {
                            SVar4 = StringFromBinaryWithSizeOrNull
                                              ((uchar *)this,*(size_t *)(in_RSI + 0x28));
                            sVar3 = SVar4.bufferSize_;
                          }
                          else if (*(long *)(in_RSI + 0x40) == 0) {
                            pcVar2 = SimpleString::asCharString((SimpleString *)(in_RSI + 0x18));
                            SVar4 = StringFromFormat((char *)this,
                                                     "No comparator found for type: \"%s\"",pcVar2);
                            sVar3 = SVar4.bufferSize_;
                          }
                          else {
                            (**(code **)(**(long **)(in_RSI + 0x40) + 0x18))
                                      (this,*(long **)(in_RSI + 0x40),*(undefined8 *)(in_RSI + 0x28)
                                      );
                            sVar3 = extraout_RDX_06;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  SVar4.bufferSize_ = sVar3;
  SVar4.buffer_ = (char *)this;
  return SVar4;
}

Assistant:

SimpleString MockNamedValue::toString() const
{
    if (type_ == "bool")
        return StringFrom(value_.boolValue_);
    else if (type_ == "int")
        return StringFrom(value_.intValue_) + " " + BracketsFormattedHexStringFrom(value_.intValue_);
    else if (type_ == "unsigned int")
        return StringFrom(value_.unsignedIntValue_) + " " + BracketsFormattedHexStringFrom(value_.unsignedIntValue_);
    else if (type_ == "long int")
        return StringFrom(value_.longIntValue_) + " " + BracketsFormattedHexStringFrom(value_.longIntValue_);
    else if (type_ == "unsigned long int")
        return StringFrom(value_.unsignedLongIntValue_) + " " + BracketsFormattedHexStringFrom(value_.unsignedLongIntValue_);
#if CPPUTEST_USE_LONG_LONG
    else if (type_ == "long long int")
        return StringFrom(value_.longLongIntValue_) + " " + BracketsFormattedHexStringFrom(value_.longLongIntValue_);
    else if (type_ == "unsigned long long int")
        return StringFrom(value_.unsignedLongLongIntValue_) + " " + BracketsFormattedHexStringFrom(value_.unsignedLongLongIntValue_);
#endif
    else if (type_ == "const char*")
        return value_.stringValue_;
    else if (type_ == "void*")
        return StringFrom(value_.pointerValue_);
    else if (type_ == "void (*)()")
        return StringFrom(value_.functionPointerValue_);
    else if (type_ == "const void*")
        return StringFrom(value_.constPointerValue_);
    else if (type_ == "double")
        return StringFrom(value_.doubleValue_.value);
    else if (type_ == "const unsigned char*")
        return StringFromBinaryWithSizeOrNull(value_.memoryBufferValue_, size_);

    if (comparator_)
        return comparator_->valueToString(value_.constObjectPointerValue_);

    return StringFromFormat("No comparator found for type: \"%s\"", type_.asCharString());

}